

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.h
# Opt level: O0

SchnorrPubkey * __thiscall
cfd::core::SchnorrPubkey::operator=(SchnorrPubkey *this,SchnorrPubkey *param_1)

{
  SchnorrPubkey *param_1_local;
  SchnorrPubkey *this_local;
  
  ByteData256::operator=(&this->data_,&param_1->data_);
  return this;
}

Assistant:

class CFD_CORE_EXPORT SchnorrPubkey {
 public:
  /**
  * @brief Size of a Schnorr public key.
  *
  */
  static constexpr uint32_t kSchnorrPubkeySize = 32;

  /**
   * @brief Default constructor.
   */
  SchnorrPubkey();

  /**
   * @brief Construct a new SchnorrPubkey object from ByteData
   *
   * @param data the data representing the adaptor nonce
   */
  explicit SchnorrPubkey(const ByteData &data);
  /**
   * @brief Construct a new SchnorrPubkey object from ByteData256
   *
   * @param data the data representing the adaptor nonce
   */
  explicit SchnorrPubkey(const ByteData256 &data);
  /**
   * @brief Construct a new Schnorr Pubkey object from a string
   *
   * @param data the data representing the adaptor nonce
   */
  explicit SchnorrPubkey(const std::string &data);

  /**
   * @brief Get the underlying ByteData object
   *
   * @return ByteData
   */
  ByteData GetData() const;
  /**
   * @brief Get the underlying ByteData256 object
   *
   * @return ByteData256
   */
  ByteData256 GetByteData256() const;
  /**
   * @brief Get the hex string.
   *
   * @return hex string.
   */
  std::string GetHex() const;
  /**
   * @brief Equals a key.
   * @param[in] pubkey  a key to compare
   * @retval true   equal.
   * @retval false  not equal.
   */
  bool Equals(const SchnorrPubkey &pubkey) const;
  /**
   * @brief Verify format.
   * @retval true   valid
   * @retval false  invalid
   */
  bool IsValid() const;

  /**
   * @brief Create new public key with tweak added.
   * @details This function doesn't have no side-effect.
   *     It always returns new instance of Privkey.
   * @param[in] tweak     tweak to be added
   * @param[out] parity   the parity of the tweaked pubkey.
   * @return new instance of pubkey key with tweak added.
   */
  SchnorrPubkey CreateTweakAdd(
      const ByteData256 &tweak, bool *parity = nullptr) const;
  /**
   * @brief Create new public key with tweak added.
   * @details This function doesn't have no side-effect.
   *     It always returns new instance of Privkey.
   * @param[in] tweak     tweak to be added
   * @param[out] parity   the parity of the tweaked pubkey.
   * @return new instance of pubkey key with tweak added.
   */
  SchnorrPubkey CreateTweakAdd(
      const SchnorrPubkey &tweak, bool *parity = nullptr) const;
  /**
   * @brief Is tweaked pubkey from a based pubkey.
   *
   * @param base_pubkey the base pubkey.
   * @param tweak the tweak bytes.
   * @param parity the parity of the tweaked pubkey.
   * @retval true   tweak from based pubkey
   * @retval false  other
   */
  bool IsTweaked(
      const SchnorrPubkey &base_pubkey, const ByteData256 &tweak,
      bool parity) const;
  /**
   * @brief Verify a Schnorr signature.
   *
   * @param signature the signature to verify.
   * @param msg the message to verify the signature against.
   * @retval true if the signature is valid
   * @retval false if the signature is invalid
   */
  bool Verify(const SchnorrSignature &signature, const ByteData256 &msg) const;

  /**
   * @brief Create public key.
   * @details This function is need set the parity.
   * @param[in] parity  the parity of the pubkey.
   * @return pubkey
   */
  Pubkey CreatePubkey(bool parity = false) const;

  /**
   * @brief get schnorr public key from private key.
   *
   * @param[in] privkey the private key from which to create the Schnorr public key.
   * @param[out] parity the parity of the tweaked pubkey.
   * @return SchnorrPubkey the public key associated with the given private key
   * generated according to BIP340.
   */
  static SchnorrPubkey FromPrivkey(
      const Privkey &privkey, bool *parity = nullptr);
  /**
   * @brief get schnorr public key from public key.
   *
   * @param[in] pubkey the public key from which to create the Schnorr public key.
   * @param[out] parity the parity of the tweaked pubkey.
   * @return SchnorrPubkey the public key associated with the given private key
   * generated according to BIP340.
   */
  static SchnorrPubkey FromPubkey(
      const Pubkey &pubkey, bool *parity = nullptr);
  /**
   * @brief Create tweak add pubkey from base privkey.
   *
   * @param[in] privkey the private key from which to create the Schnorr public key.
   * @param[in] tweak the tweak to be added
   * @param[out] tweaked_privkey the tweaked private key.
   * @param[out] parity the parity of the tweaked pubkey.
   * @return SchnorrPubkey the tweaked public key associated with the given private key
   * generated according to BIP340.
   */
  static SchnorrPubkey CreateTweakAddFromPrivkey(
      const Privkey &privkey, const ByteData256 &tweak,
      Privkey *tweaked_privkey, bool *parity = nullptr);

  /**
   * @brief tweak add pubkey.
   * @param[in] right   tweak data
   * @return tweaked pubkey
   */
  SchnorrPubkey operator+=(const ByteData256 &right);
  /**
   * @brief negate and tweak add for pubkey.
   * @param[in] right   tweak data (before negate)
   * @return tweaked pubkey
   */
  SchnorrPubkey operator-=(const ByteData256 &right);

 private:
  ByteData256 data_;  //!< The underlying data
}